

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O0

int __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<84>::ReadFloatMantissa
          (BigUnsigned<84> *this,ParsedFloat *fp,int significant_digits)

{
  int iVar1;
  int exponent_adjust;
  int significant_digits_local;
  ParsedFloat *fp_local;
  BigUnsigned<84> *this_local;
  
  SetToZero(this);
  if (fp->type != kNumber) {
    __assert_fail("fp.type == FloatType::kNumber",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/charconv_bigint.cc"
                  ,0xae,
                  "int absl::strings_internal::BigUnsigned<84>::ReadFloatMantissa(const ParsedFloat &, int) [max_words = 84]"
                 );
  }
  if (fp->subrange_begin == (char *)0x0) {
    this->words_[0] = (uint32_t)fp->mantissa;
    this->words_[1] = (uint32_t)(fp->mantissa >> 0x20);
    if (this->words_[1] == 0) {
      if (this->words_[0] != 0) {
        this->size_ = 1;
      }
    }
    else {
      this->size_ = 2;
    }
    this_local._4_4_ = fp->exponent;
  }
  else {
    iVar1 = ReadDigits(this,fp->subrange_begin,fp->subrange_end,significant_digits);
    this_local._4_4_ = fp->literal_exponent + iVar1;
  }
  return this_local._4_4_;
}

Assistant:

int BigUnsigned<max_words>::ReadFloatMantissa(const ParsedFloat& fp,
                                              int significant_digits) {
  SetToZero();
  assert(fp.type == FloatType::kNumber);

  if (fp.subrange_begin == nullptr) {
    // We already exactly parsed the mantissa, so no more work is necessary.
    words_[0] = fp.mantissa & 0xffffffffu;
    words_[1] = fp.mantissa >> 32;
    if (words_[1]) {
      size_ = 2;
    } else if (words_[0]) {
      size_ = 1;
    }
    return fp.exponent;
  }
  int exponent_adjust =
      ReadDigits(fp.subrange_begin, fp.subrange_end, significant_digits);
  return fp.literal_exponent + exponent_adjust;
}